

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool slang::ast::Lookup::findTempVar
               (Scope *scope,TempVarSymbol *symbol,NameSyntax *syntax,LookupResult *result)

{
  SyntaxKind SVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  LookupLocation lookupLocation;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *nameParts_00;
  long *in_RCX;
  SyntaxNode *in_RDX;
  long in_RSI;
  ASTContext context;
  LookupResult *in_stack_00000118;
  ASTContext *in_stack_00000120;
  bitmask<slang::ast::LookupFlags> in_stack_0000012c;
  TempVarSymbol *curr;
  NameComponents name;
  NameSyntax *first;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int colonParts;
  Scope *in_stack_fffffffffffffce0;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *in_stack_fffffffffffffce8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffcf0;
  Scope *in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  char *in_stack_fffffffffffffd10;
  int *in_stack_fffffffffffffd30;
  ScopedNameSyntax *in_stack_fffffffffffffd40;
  NameSyntax *in_stack_fffffffffffffd58;
  NameComponents *in_stack_fffffffffffffd60;
  bitmask<slang::ast::ASTFlags> local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  long local_1f8;
  undefined1 local_1f0 [56];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_180;
  SyntaxNode *local_170;
  int local_2c;
  long *local_28;
  SyntaxNode *local_20;
  long local_18;
  bool local_1;
  
  local_2c = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x65650f);
  local_170 = local_20;
  if (local_20->kind == ScopedName) {
    nameParts_00 = (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                   slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(local_20);
    local_170 = (SyntaxNode *)
                anon_unknown_39::splitScopedName
                          (in_stack_fffffffffffffd40,nameParts_00,in_stack_fffffffffffffd30);
    if (local_2c != 0) {
      local_1 = false;
      goto LAB_00656846;
    }
  }
  anon_unknown_39::NameComponents::NameComponents((NameComponents *)in_stack_fffffffffffffce0);
  SVar1 = (((ExpressionSyntax *)&local_170->kind)->super_SyntaxNode).kind;
  if ((SVar1 == ClassName) || (SVar1 == IdentifierName || SVar1 == IdentifierSelectName)) {
    anon_unknown_39::NameComponents::NameComponents
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    memcpy(&local_1b8,local_1f0,0x38);
    local_1f8 = local_18;
    do {
      local_208 = *(undefined8 *)(local_1f8 + 8);
      local_200 = *(undefined8 *)(local_1f8 + 0x10);
      local_218 = local_1b8;
      local_210 = uStack_1b0;
      __x._M_str = in_stack_fffffffffffffd10;
      __x._M_len = in_stack_fffffffffffffd08;
      __y._M_str = in_stack_fffffffffffffd00;
      __y._M_len = (size_t)in_stack_fffffffffffffcf8;
      bVar2 = std::operator==(__x,__y);
      if (bVar2) {
        *local_28 = local_1f8;
        break;
      }
      local_1f8 = *(long *)(local_1f8 + 0x158);
    } while (local_1f8 != 0);
    if (*local_28 == 0) {
      local_1 = false;
    }
    else {
      local_268 = LookupLocation::max;
      uStack_260 = DAT_00dd1ab8;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_270,None);
      lookupLocation._8_8_ = in_stack_fffffffffffffd00;
      lookupLocation.scope = in_stack_fffffffffffffcf8;
      ASTContext::ASTContext
                ((ASTContext *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,lookupLocation,
                 in_stack_fffffffffffffcf0);
      std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
      span<slang::SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>_&>
                ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                  *)in_stack_fffffffffffffcf0.m_bits,in_stack_fffffffffffffce8);
      bitmask<slang::ast::LookupFlags>::bitmask
                ((bitmask<slang::ast::LookupFlags> *)&stack0xfffffffffffffd44,None);
      local_1 = anon_unknown_39::lookupDownward
                          ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                            )_curr,(NameComponents)nameParts.stackBase._48_56_,in_stack_00000120,
                           in_stack_0000012c,in_stack_00000118);
    }
  }
  else {
    local_1 = false;
  }
LAB_00656846:
  local_180 = 1;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::~SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x656853);
  return (bool)(local_1 & 1);
}

Assistant:

bool Lookup::findTempVar(const Scope& scope, const TempVarSymbol& symbol, const NameSyntax& syntax,
                         LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName) {
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);
        if (colonParts)
            return false;
    }

    NameComponents name;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = *first;
            break;
        default:
            return false;
    }

    const TempVarSymbol* curr = &symbol;
    do {
        if (curr->name == name.text) {
            result.found = curr;
            break;
        }
        curr = curr->nextTemp;
    } while (curr);

    if (!result.found)
        return false;

    ASTContext context(scope, LookupLocation::max);
    return lookupDownward(nameParts, name, context, LookupFlags::None, result);
}